

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::HeapTypeChildCollector::~HeapTypeChildCollector(HeapTypeChildCollector *this)

{
  HeapTypeChildCollector *this_local;
  
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&this->children);
  HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>::~HeapTypeChildWalker
            (&this->super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>);
  return;
}

Assistant:

void noteChild(HeapType type) { children.push_back(type); }